

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers
          (TracingServiceImpl *this,TracingSession *tracing_session,ProducerEndpointImpl *producer)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  ushort uVar3;
  ushort writer_id;
  uint32_t page_layout;
  ushort *puVar4;
  uint32_t uVar5;
  _Base_ptr p_Var6;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  _Var7;
  ushort *puVar8;
  ushort *puVar9;
  _Base_ptr p_Var10;
  ushort num_fragments;
  _Base_ptr p_Var11;
  ulong uVar12;
  long lVar13;
  uint32_t chunk_idx;
  uint uVar14;
  bool bVar15;
  Optional<unsigned_short> target_buffer_id;
  Chunk chunk;
  
  if (producer->smb_scraping_enabled_ != true) {
    return;
  }
  if ((producer->writers_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return;
  }
  puVar9 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (tracing_session->buffers_index).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (long)puVar4 - (long)puVar9;
  if (0 < (long)uVar12 >> 3) {
    p_Var10 = (producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var1 = &(producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header;
    puVar8 = (ushort *)((uVar12 & 0xfffffffffffffff8) + (long)puVar9);
    lVar13 = (long)uVar12 >> 3;
    do {
      if (p_Var10 != (_Base_ptr)0x0) {
        uVar2 = *puVar9;
        p_Var11 = &p_Var1->_M_header;
        p_Var6 = p_Var10;
        do {
          bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
          if (!bVar15) {
            p_Var11 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar15];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) goto LAB_002b08f8;
        uVar2 = puVar9[1];
        p_Var11 = &p_Var1->_M_header;
        p_Var6 = p_Var10;
        do {
          bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
          if (!bVar15) {
            p_Var11 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar15];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) {
          puVar9 = puVar9 + 1;
          goto LAB_002b08f8;
        }
        uVar2 = puVar9[2];
        p_Var11 = &p_Var1->_M_header;
        p_Var6 = p_Var10;
        do {
          bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
          if (!bVar15) {
            p_Var11 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar15];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) {
          puVar9 = puVar9 + 2;
          goto LAB_002b08f8;
        }
        uVar2 = puVar9[3];
        p_Var11 = &p_Var1->_M_header;
        p_Var6 = p_Var10;
        do {
          bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
          if (!bVar15) {
            p_Var11 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[bVar15];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
           ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) {
          puVar9 = puVar9 + 3;
          goto LAB_002b08f8;
        }
      }
      puVar9 = puVar9 + 4;
      bVar15 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar15);
    uVar12 = (long)puVar4 - (long)puVar8;
    puVar9 = puVar8;
  }
  lVar13 = (long)uVar12 >> 1;
  if (lVar13 == 3) {
    p_Var10 = (producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    if (p_Var10 != (_Base_ptr)0x0) {
      uVar2 = *puVar9;
      p_Var1 = &(producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var1->_M_header;
      p_Var6 = p_Var10;
      do {
        bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
        if (!bVar15) {
          p_Var11 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar15];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) goto LAB_002b08f8;
    }
    puVar9 = puVar9 + 1;
LAB_002b0864:
    if (p_Var10 != (_Base_ptr)0x0) {
      uVar2 = *puVar9;
      p_Var1 = &(producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var1->_M_header;
      p_Var6 = p_Var10;
      do {
        bVar15 = (ushort)(short)p_Var6[1]._M_color < (ushort)uVar2;
        if (!bVar15) {
          p_Var11 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[bVar15];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         ((ushort)(short)p_Var11[1]._M_color <= (ushort)uVar2)) goto LAB_002b08f8;
    }
    puVar9 = puVar9 + 1;
  }
  else {
    if (lVar13 == 2) {
      p_Var10 = (producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      goto LAB_002b0864;
    }
    if (lVar13 != 1) {
      return;
    }
    p_Var10 = (producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
  }
  if (p_Var10 == (_Base_ptr)0x0) {
    return;
  }
  uVar2 = *puVar9;
  p_Var1 = &(producer->allowed_target_buffers_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var1->_M_header;
  do {
    bVar15 = (ushort)(short)p_Var10[1]._M_color < (ushort)uVar2;
    if (!bVar15) {
      p_Var6 = p_Var10;
    }
    p_Var10 = (&p_Var10->_M_left)[bVar15];
  } while (p_Var10 != (_Base_ptr)0x0);
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    return;
  }
  if ((ushort)uVar2 < (ushort)(short)p_Var6[1]._M_color) {
    return;
  }
LAB_002b08f8:
  if ((puVar9 != puVar4) && ((producer->shmem_abi_).num_pages_ != 0)) {
    p_Var1 = &(producer->writers_)._M_t._M_impl.super__Rb_tree_header;
    uVar12 = 0;
    do {
      page_layout = *(uint32_t *)
                     ((producer->shmem_abi_).start_ + (producer->shmem_abi_).page_size_ * uVar12);
      uVar5 = SharedMemoryABI::GetUsedChunks(page_layout);
      if (uVar5 != 0) {
        lVar13 = 0;
        do {
          if ((uVar5 & 1) != 0) {
            uVar14 = page_layout >> ((uint8_t)lVar13 * '\x02' & 0x1f) & 3;
            uVar3 = (producer->shmem_abi_).chunk_sizes_._M_elems[page_layout >> 0x1c & 7];
            SharedMemoryABI::Chunk::Chunk
                      (&chunk,(producer->shmem_abi_).start_ +
                              (ulong)uVar3 * lVar13 + (producer->shmem_abi_).page_size_ * uVar12 + 8
                       ,uVar3,(uint8_t)lVar13);
            uVar3 = *(ushort *)(chunk.begin_ + 6);
            num_fragments = uVar3 & 0x3ff;
            if ((uVar14 == 3) || (1 < num_fragments)) {
              writer_id = *(ushort *)(chunk.begin_ + 4);
              p_Var10 = (producer->writers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var6 = &p_Var1->_M_header;
              if (p_Var10 != (_Base_ptr)0x0) {
                do {
                  bVar15 = (ushort)*(size_t *)(p_Var10 + 1) < writer_id;
                  if (!bVar15) {
                    p_Var6 = p_Var10;
                  }
                  p_Var10 = (&p_Var10->_M_left)[bVar15];
                } while (p_Var10 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
                   ((ushort)((_Rb_tree_header *)p_Var6)->_M_node_count <= writer_id)) {
                  target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                  super_OptionalStorageBase<unsigned_short,_true>.is_populated_ = true;
                  target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                  super_OptionalStorageBase<unsigned_short,_true>.field_1 =
                       *(anon_union_2_2_929a363d_for_OptionalStorageBase<unsigned_short,_true>_3 *)
                        ((long)&((_Rb_tree_header *)p_Var6)->_M_node_count + 2);
                  _Var7 = ::std::
                          __find_if<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                    ((tracing_session->buffers_index).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (tracing_session->buffers_index).
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                                     &target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                                      super_OptionalStorageBase<unsigned_short,_true>.field_1);
                  if (_Var7._M_current !=
                      (tracing_session->buffers_index).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    CopyProducerPageIntoLogBuffer
                              (this,producer->id_,producer->uid_,producer->pid_,writer_id,
                               *(ChunkID *)chunk.begin_,
                               target_buffer_id.super_OptionalBase<unsigned_short>.storage_.
                               super_OptionalStorageBase<unsigned_short,_true>.field_1.value_,
                               num_fragments,(byte)(uVar3 >> 10),uVar14 == 3,chunk.begin_ + 8,
                               (ulong)chunk.size_ - 8);
                  }
                }
              }
            }
          }
          lVar13 = lVar13 + 1;
          bVar15 = 1 < uVar5;
          uVar5 = uVar5 >> 1;
        } while (bVar15);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (producer->shmem_abi_).num_pages_);
  }
  return;
}

Assistant:

void TracingServiceImpl::ScrapeSharedMemoryBuffers(
    TracingSession* tracing_session,
    ProducerEndpointImpl* producer) {
  if (!producer->smb_scraping_enabled_)
    return;

  // Can't copy chunks if we don't know about any trace writers.
  if (producer->writers_.empty())
    return;

  // Performance optimization: On flush or session disconnect, this method is
  // called for each producer. If the producer doesn't participate in the
  // session, there's no need to scape its chunks right now. We can tell if a
  // producer participates in the session by checking if the producer is allowed
  // to write into the session's log buffers.
  const auto& session_buffers = tracing_session->buffers_index;
  bool producer_in_session =
      std::any_of(session_buffers.begin(), session_buffers.end(),
                  [producer](BufferID buffer_id) {
                    return producer->allowed_target_buffers_.count(buffer_id);
                  });
  if (!producer_in_session)
    return;

  PERFETTO_DLOG("Scraping SMB for producer %" PRIu16, producer->id_);

  // Find and copy any uncommitted chunks from the SMB.
  //
  // In nominal conditions, the page layout of the used SMB pages should never
  // change because the service is the only one who is supposed to modify used
  // pages (to make them free again).
  //
  // However, the code here needs to deal with the case of a malicious producer
  // altering the SMB in unpredictable ways. Thankfully the SMB size is
  // immutable, so a chunk will always point to some valid memory, even if the
  // producer alters the intended layout and chunk header concurrently.
  // Ultimately a malicious producer altering the SMB's chunk layout while we
  // are iterating in this function is not any different from the case of a
  // malicious producer asking to commit a chunk made of random data, which is
  // something this class has to deal with regardless.
  //
  // The only legitimate mutations that can happen from sane producers,
  // concurrently to this function, are:
  //   A. free pages being partitioned,
  //   B. free chunks being migrated to kChunkBeingWritten,
  //   C. kChunkBeingWritten chunks being migrated to kChunkCompleted.

  SharedMemoryABI* abi = &producer->shmem_abi_;
  // num_pages() is immutable after the SMB is initialized and cannot be changed
  // even by a producer even if malicious.
  for (size_t page_idx = 0; page_idx < abi->num_pages(); page_idx++) {
    uint32_t layout = abi->GetPageLayout(page_idx);

    uint32_t used_chunks = abi->GetUsedChunks(layout);  // Returns a bitmap.
    // Skip empty pages.
    if (used_chunks == 0)
      continue;

    // Scrape the chunks that are currently used. These should be either in
    // state kChunkBeingWritten or kChunkComplete.
    for (uint32_t chunk_idx = 0; used_chunks; chunk_idx++, used_chunks >>= 1) {
      if (!(used_chunks & 1))
        continue;

      SharedMemoryABI::ChunkState state =
          SharedMemoryABI::GetChunkStateFromLayout(layout, chunk_idx);
      PERFETTO_DCHECK(state == SharedMemoryABI::kChunkBeingWritten ||
                      state == SharedMemoryABI::kChunkComplete);
      bool chunk_complete = state == SharedMemoryABI::kChunkComplete;

      SharedMemoryABI::Chunk chunk =
          abi->GetChunkUnchecked(page_idx, layout, chunk_idx);

      uint16_t packet_count;
      uint8_t flags;
      // GetPacketCountAndFlags has acquire_load semantics.
      std::tie(packet_count, flags) = chunk.GetPacketCountAndFlags();

      // It only makes sense to copy an incomplete chunk if there's at least
      // one full packet available. (The producer may not have completed the
      // last packet in it yet, so we need at least 2.)
      if (!chunk_complete && packet_count < 2)
        continue;

      // At this point, it is safe to access the remaining header fields of
      // the chunk. Even if the chunk was only just transferred from
      // kChunkFree into kChunkBeingWritten state, the header should be
      // written completely once the packet count increased above 1 (it was
      // reset to 0 by the service when the chunk was freed).

      WriterID writer_id = chunk.writer_id();
      base::Optional<BufferID> target_buffer_id =
          producer->buffer_id_for_writer(writer_id);

      // We can only scrape this chunk if we know which log buffer to copy it
      // into.
      if (!target_buffer_id)
        continue;

      // Skip chunks that don't belong to the requested tracing session.
      bool target_buffer_belongs_to_session =
          std::find(session_buffers.begin(), session_buffers.end(),
                    *target_buffer_id) != session_buffers.end();
      if (!target_buffer_belongs_to_session)
        continue;

      uint32_t chunk_id =
          chunk.header()->chunk_id.load(std::memory_order_relaxed);

      CopyProducerPageIntoLogBuffer(
          producer->id_, producer->uid_, producer->pid_, writer_id, chunk_id,
          *target_buffer_id, packet_count, flags, chunk_complete,
          chunk.payload_begin(), chunk.payload_size());
    }
  }
}